

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O3

int CloseRS232Port(RS232PORT *pRS232Port)

{
  int iVar1;
  
  switch(pRS232Port->DevType) {
  case 0:
    iVar1 = *(int *)&pRS232Port->hDev;
    goto LAB_00105553;
  case 1:
  case 3:
    iVar1 = pRS232Port->s;
    break;
  case 2:
    iVar1 = pRS232Port->s;
    shutdown(iVar1,2);
    close(iVar1);
  case 4:
    iVar1 = pRS232Port->s_srv;
    break;
  default:
    return 1;
  }
  shutdown(iVar1,2);
LAB_00105553:
  iVar1 = close(iVar1);
  return (uint)(iVar1 != 0);
}

Assistant:

inline int CloseRS232Port(RS232PORT* pRS232Port)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
		return releasetcpcli(pRS232Port->s);
	case TCP_SERVER_TYPE_RS232PORT:
		if (disconnectclifromtcpsrv(pRS232Port->s) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_RS232PORT(("CloseRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
				strtime_m(), 
				"Error disconnecting a client. ", 
				pRS232Port));
		}
		return releasetcpsrv(pRS232Port->s_srv);
	case UDP_CLIENT_TYPE_RS232PORT:
		return releaseudpcli(pRS232Port->s);
	case UDP_SERVER_TYPE_RS232PORT:
		if (disconnectclifromudpsrv(pRS232Port->s) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_RS232PORT(("CloseRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
				strtime_m(), 
				"Error disconnecting a client. ", 
				pRS232Port));
		}
		return releaseudpsrv(pRS232Port->s_srv);
	case LOCAL_TYPE_RS232PORT:
		return CloseComputerRS232Port(pRS232Port->hDev);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("CloseRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port));
		return EXIT_FAILURE;
	}
}